

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deStringUtil.hpp
# Opt level: O0

string * __thiscall de::toString<char_const*>(string *__return_storage_ptr__,de *this,char **value)

{
  ostringstream local_190 [8];
  ostringstream s;
  char **value_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,*(char **)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString (const T& value)
{
	std::ostringstream s;
	s << value;
	return s.str();
}